

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer_parallel.h
# Opt level: O3

void __thiscall
agge::renderer_parallel::operator()
          (renderer_parallel *this,bitmap<unsigned_char,_0UL,_0UL> *bitmap_,vector_i offset,
          rect_i *window,mask_full<8UL> *mask,blender<unsigned_char,_unsigned_char> *blender,
          simple_alpha<unsigned_char,_8UL> *alpha)

{
  vector_i vVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  kernel_function kernel;
  blender<unsigned_char,_unsigned_char> *local_70;
  vector_i local_68;
  ulong local_60;
  undefined8 local_58;
  bitmap<unsigned_char,_0UL,_0UL> *local_48;
  kernel_function local_38;
  blender<unsigned_char,_unsigned_char> **local_30;
  renderer_parallel *local_28;
  mask_full<8UL> *local_20;
  simple_alpha<unsigned_char,_8UL> *local_18;
  
  uVar4 = (ulong)offset >> 0x20;
  iVar3 = bitmap_->_width + offset.dx;
  iVar2 = bitmap_->_height + offset.dy;
  vVar1 = offset;
  if (window != (rect_i *)0x0) {
    vVar1.dy = 0;
    vVar1.dx = window->x1;
    if (window->x1 <= offset.dx) {
      vVar1 = (vector_i)((ulong)offset & 0xffffffff);
    }
    if (offset.dy < window->y1) {
      uVar4 = (ulong)(uint)window->y1;
    }
    if (window->x2 <= iVar3) {
      iVar3 = window->x2;
    }
    if (window->y2 <= iVar2) {
      iVar2 = window->y2;
    }
  }
  local_60 = (ulong)vVar1 & 0xffffffff | uVar4 << 0x20;
  local_58 = CONCAT44(iVar2,iVar3);
  local_30 = &local_70;
  local_38._vptr_kernel_function = (_func_int **)&PTR_operator___001c2f18;
  local_18 = alpha;
  local_70 = blender;
  local_68 = offset;
  local_48 = bitmap_;
  local_28 = this;
  local_20 = mask;
  parallel::call(&this->_parallel,&local_38);
  return;
}

Assistant:

void renderer_parallel::operator ()(BitmapT &bitmap_, vector_i offset, const rect_i *window,
		const MaskT &mask, const BlenderT &blender, const AlphaFn &alpha)
	{
		typedef renderer::adapter<BitmapT, BlenderT> rendition_adapter;

		struct kernel_function : parallel::kernel_function, noncopyable
		{
			kernel_function(const rendition_adapter &adapter_, const renderer_parallel &renderer_, const MaskT &mask_,
					const AlphaFn &alpha_)
				: adapter(adapter_), renderer(renderer_), mask(mask_), alpha(alpha_)
			{	}

			virtual void operator ()(count_t threadid)
			{
				rendition_adapter ra_thread(adapter);
				scanline_adapter<rendition_adapter> sl(ra_thread, renderer._scanline_caches[threadid], mask.width());

				render(sl, mask, alpha, threadid, renderer._parallelism);
			}

			const rendition_adapter &adapter;
			const renderer_parallel &renderer;
			const MaskT &mask;
			const AlphaFn &alpha;
		};

		const rendition_adapter adapter(bitmap_, offset, window, blender);
		kernel_function kernel(adapter, *this, mask, alpha);

		_parallel.call(kernel);
	}